

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MSX.cpp
# Opt level: O2

void __thiscall
MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true>::i8255PortHandler::
set_activity_observer(i8255PortHandler *this,Observer *observer)

{
  Observer *pOVar1;
  bool bVar2;
  allocator<char> local_31;
  string local_30 [32];
  
  this->activity_observer_ = observer;
  if (observer != (Observer *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>(local_30,"Tape motor",&local_31);
    (*observer->_vptr_Observer[2])(observer,local_30,0);
    std::__cxx11::string::~string(local_30);
    pOVar1 = this->activity_observer_;
    std::__cxx11::string::string<std::allocator<char>>(local_30,"Tape motor",&local_31);
    bVar2 = Storage::Tape::BinaryTapePlayer::get_motor_control(this->tape_player_);
    (*pOVar1->_vptr_Observer[4])(pOVar1,local_30,(ulong)bVar2);
    std::__cxx11::string::~string(local_30);
  }
  return;
}

Assistant:

void set_activity_observer(Activity::Observer *observer) {
					activity_observer_ = observer;
					if(activity_observer_) {
						activity_observer_->register_led("Tape motor");
						activity_observer_->set_led_status("Tape motor", tape_player_.get_motor_control());
					}
				}